

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

VariableValue * __thiscall rsg::VariableValue::operator=(VariableValue *this,VariableValue *other)

{
  VariableType *pVVar1;
  ConstStridedValueAccess<1> local_48;
  ConstValueAccess local_38;
  StridedValueRead<1> local_28;
  VariableValue *local_18;
  VariableValue *other_local;
  VariableValue *this_local;
  
  this->m_variable = other->m_variable;
  local_18 = other;
  other_local = this;
  pVVar1 = getType(this);
  ValueStorage<1>::setStorage(&this->m_storage,pVVar1);
  local_38 = getValue(local_18);
  local_28 = ConstStridedValueAccess<1>::value(&local_38);
  pVVar1 = getType(this);
  local_48 = (ConstStridedValueAccess<1>)ValueStorage<1>::getValue(&this->m_storage,pVVar1);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_48,&local_28);
  return this;
}

Assistant:

VariableValue& VariableValue::operator= (const VariableValue& other)
{
	m_variable	= other.m_variable;
	m_storage.setStorage(getType());
	m_storage.getValue(getType()) = other.getValue().value();
	return *this;
}